

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int viewGetColumnNames(Parse *pParse,Table *pTable)

{
  i16 *pnCol;
  u16 *puVar1;
  Lookaside *pLVar2;
  u8 uVar3;
  int iVar4;
  sqlite3 *db;
  sqlite3_xauth p_Var5;
  char *p;
  u16 uVar6;
  int iVar7;
  VTable *pVVar8;
  Module *pMod;
  Select *pSelect;
  Table *pTable_00;
  long in_FS_OFFSET;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = pParse->db;
  if (pTable->eTabType == '\x01') {
    db->nSchemaLock = db->nSchemaLock + 1;
    pVVar8 = sqlite3GetVTable(db,pTable);
    iVar7 = 0;
    if (pVVar8 == (VTable *)0x0) {
      pMod = (Module *)sqlite3HashFind(&db->aModule,*(pTable->u).vtab.azArg);
      if (pMod == (Module *)0x0) {
        sqlite3ErrorMsg(pParse,"no such module: %s",((pTable->u).tab.pFKey)->pFrom);
        iVar7 = 1;
      }
      else {
        local_40 = (char *)0x0;
        iVar7 = vtabCallConstructor(db,pTable,pMod,pMod->pModule->xConnect,&local_40);
        p = local_40;
        if (iVar7 != 0) {
          sqlite3ErrorMsg(pParse,"%s",local_40);
          pParse->rc = iVar7;
        }
        sqlite3DbFree(db,p);
      }
    }
    db->nSchemaLock = db->nSchemaLock - 1;
  }
  else if (pTable->nCol < 0) {
    sqlite3ErrorMsg(pParse,"view %s is circularly defined",pTable->zName);
    iVar7 = 1;
  }
  else {
    pSelect = sqlite3SelectDup(db,(pTable->u).view.pSelect,0);
    if (pSelect == (Select *)0x0) {
      iVar7 = 1;
    }
    else {
      pnCol = &pTable->nCol;
      uVar3 = pParse->eParseMode;
      iVar7 = pParse->nTab;
      iVar4 = pParse->nSelect;
      pParse->eParseMode = '\0';
      sqlite3SrcListAssignCursors(pParse,pSelect->pSrc);
      *pnCol = -1;
      (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
      (db->lookaside).sz = 0;
      p_Var5 = db->xAuth;
      db->xAuth = (sqlite3_xauth)0x0;
      pTable_00 = sqlite3ResultSetOfSelect(pParse,pSelect,'@');
      db->xAuth = p_Var5;
      pParse->nTab = iVar7;
      pParse->nSelect = iVar4;
      if (pTable_00 == (Table *)0x0) {
        *pnCol = 0;
        iVar7 = 1;
      }
      else if (pTable->pCheck == (ExprList *)0x0) {
        pTable->nCol = pTable_00->nCol;
        pTable->aCol = pTable_00->aCol;
        pTable->tabFlags = pTable->tabFlags | pTable_00->tabFlags & 0x62;
        pTable_00->nCol = 0;
        pTable_00->aCol = (Column *)0x0;
        iVar7 = 0;
      }
      else {
        sqlite3ColumnsFromExprList(pParse,pTable->pCheck,pnCol,&pTable->aCol);
        iVar7 = 0;
        if ((pParse->nErr == 0) && (pSelect->pEList->nExpr == (int)*pnCol)) {
          sqlite3SubqueryColumnTypes(pParse,pTable,pSelect,'@');
        }
      }
      pTable->nNVCol = pTable->nCol;
      sqlite3DeleteTable(db,pTable_00);
      sqlite3SelectDelete(db,pSelect);
      pLVar2 = &db->lookaside;
      pLVar2->bDisable = pLVar2->bDisable - 1;
      if (pLVar2->bDisable == 0) {
        uVar6 = (db->lookaside).szTrue;
      }
      else {
        uVar6 = 0;
      }
      (db->lookaside).sz = uVar6;
      pParse->eParseMode = uVar3;
    }
    puVar1 = &pTable->pSchema->schemaFlags;
    *puVar1 = *puVar1 | 2;
    if (db->mallocFailed != '\0') {
      sqlite3DeleteColumnNames(db,pTable);
    }
    iVar7 = iVar7 + pParse->nErr;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

static SQLITE_NOINLINE int viewGetColumnNames(Parse *pParse, Table *pTable){
  Table *pSelTab;   /* A fake table from which we get the result set */
  Select *pSel;     /* Copy of the SELECT that implements the view */
  int nErr = 0;     /* Number of errors encountered */
  sqlite3 *db = pParse->db;  /* Database connection for malloc errors */
#ifndef SQLITE_OMIT_VIRTUALTABLE
  int rc;
#endif
#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth;       /* Saved xAuth pointer */
#endif

  assert( pTable );

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTable) ){
    db->nSchemaLock++;
    rc = sqlite3VtabCallConnect(pParse, pTable);
    db->nSchemaLock--;
    return rc;
  }
#endif

#ifndef SQLITE_OMIT_VIEW
  /* A positive nCol means the columns names for this view are
  ** already known.  This routine is not called unless either the
  ** table is virtual or nCol is zero.
  */
  assert( pTable->nCol<=0 );

  /* A negative nCol is a special marker meaning that we are currently
  ** trying to compute the column names.  If we enter this routine with
  ** a negative nCol, it means two or more views form a loop, like this:
  **
  **     CREATE VIEW one AS SELECT * FROM two;
  **     CREATE VIEW two AS SELECT * FROM one;
  **
  ** Actually, the error above is now caught prior to reaching this point.
  ** But the following test is still important as it does come up
  ** in the following:
  **
  **     CREATE TABLE main.ex1(a);
  **     CREATE TEMP VIEW ex1 AS SELECT a FROM ex1;
  **     SELECT * FROM temp.ex1;
  */
  if( pTable->nCol<0 ){
    sqlite3ErrorMsg(pParse, "view %s is circularly defined", pTable->zName);
    return 1;
  }
  assert( pTable->nCol>=0 );

  /* If we get this far, it means we need to compute the table names.
  ** Note that the call to sqlite3ResultSetOfSelect() will expand any
  ** "*" elements in the results set of the view and will assign cursors
  ** to the elements of the FROM clause.  But we do not want these changes
  ** to be permanent.  So the computation is done on a copy of the SELECT
  ** statement that defines the view.
  */
  assert( IsView(pTable) );
  pSel = sqlite3SelectDup(db, pTable->u.view.pSelect, 0);
  if( pSel ){
    u8 eParseMode = pParse->eParseMode;
    int nTab = pParse->nTab;
    int nSelect = pParse->nSelect;
    pParse->eParseMode = PARSE_MODE_NORMAL;
    sqlite3SrcListAssignCursors(pParse, pSel->pSrc);
    pTable->nCol = -1;
    DisableLookaside;
#ifndef SQLITE_OMIT_AUTHORIZATION
    xAuth = db->xAuth;
    db->xAuth = 0;
    pSelTab = sqlite3ResultSetOfSelect(pParse, pSel, SQLITE_AFF_NONE);
    db->xAuth = xAuth;
#else
    pSelTab = sqlite3ResultSetOfSelect(pParse, pSel, SQLITE_AFF_NONE);
#endif
    pParse->nTab = nTab;
    pParse->nSelect = nSelect;
    if( pSelTab==0 ){
      pTable->nCol = 0;
      nErr++;
    }else if( pTable->pCheck ){
      /* CREATE VIEW name(arglist) AS ...
      ** The names of the columns in the table are taken from
      ** arglist which is stored in pTable->pCheck.  The pCheck field
      ** normally holds CHECK constraints on an ordinary table, but for
      ** a VIEW it holds the list of column names.
      */
      sqlite3ColumnsFromExprList(pParse, pTable->pCheck,
                                 &pTable->nCol, &pTable->aCol);
      if( pParse->nErr==0
       && pTable->nCol==pSel->pEList->nExpr
      ){
        assert( db->mallocFailed==0 );
        sqlite3SubqueryColumnTypes(pParse, pTable, pSel, SQLITE_AFF_NONE);
      }
    }else{
      /* CREATE VIEW name AS...  without an argument list.  Construct
      ** the column names from the SELECT statement that defines the view.
      */
      assert( pTable->aCol==0 );
      pTable->nCol = pSelTab->nCol;
      pTable->aCol = pSelTab->aCol;
      pTable->tabFlags |= (pSelTab->tabFlags & COLFLAG_NOINSERT);
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      assert( sqlite3SchemaMutexHeld(db, 0, pTable->pSchema) );
    }
    pTable->nNVCol = pTable->nCol;
    sqlite3DeleteTable(db, pSelTab);
    sqlite3SelectDelete(db, pSel);
    EnableLookaside;
    pParse->eParseMode = eParseMode;
  } else {
    nErr++;
  }
  pTable->pSchema->schemaFlags |= DB_UnresetViews;
  if( db->mallocFailed ){
    sqlite3DeleteColumnNames(db, pTable);
  }
#endif /* SQLITE_OMIT_VIEW */
  return nErr + pParse->nErr;
}